

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.h
# Opt level: O3

bool __thiscall mkvmuxer::Segment::CuesTrack(Segment *this,uint64_t track_number)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)(int)(this->tracks_).track_entries_size_;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      if ((this->tracks_).track_entries_[lVar2]->number_ == track_number) {
        this->cues_track_ = track_number;
        return true;
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  return false;
}

Assistant:

uint32_t track_entries_size() const { return track_entries_size_; }